

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax*>::
emplace_back<slang::syntax::PackageImportDeclarationSyntax*>
          (SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax*> *this,
          PackageImportDeclarationSyntax **args)

{
  long lVar1;
  reference ppPVar2;
  pointer ppPVar3;
  
  lVar1 = *(long *)(this + 8);
  ppPVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppPVar3 = emplaceRealloc<slang::syntax::PackageImportDeclarationSyntax*>(this,ppPVar3,args);
    return ppPVar3;
  }
  *ppPVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppPVar2 = SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*>::back
                      ((SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*> *)this);
  return ppPVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }